

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

BailOutInfo * __thiscall IR::Instr::UnlinkBailOutInfo(Instr *this)

{
  IRKind IVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Func *local_20;
  BailOutInfo *bailOutInfo;
  Instr *this_local;
  
  bVar3 = HasBailOutInfo(this);
  if ((!bVar3) && (bVar3 = HasAuxBailOut(this), !bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x4cc,"(this->HasBailOutInfo() || this->HasAuxBailOut())",
                       "this->HasBailOutInfo() || this->HasAuxBailOut()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  IVar1 = this->m_kind;
  if (IVar1 == InstrKindInstr) {
    local_20 = (Func *)this[1]._vptr_Instr;
    this[1]._vptr_Instr = (_func_int **)0x0;
  }
  else if (IVar1 == InstrKindBranch) {
    local_20 = this[1].m_func;
    this[1].m_func = (Func *)0x0;
  }
  else {
    if (IVar1 != InstrKindProfiled) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0x4dd,"(false)","false");
      if (bVar3) {
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
        return (BailOutInfo *)0x0;
      }
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    local_20 = *(Func **)&this[1].m_noLazyHelperAssert;
    this[1].m_noLazyHelperAssert = false;
    *(undefined3 *)&this[1].field_0x9 = 0;
    this[1].bailOutByteCodeLocation = 0;
  }
  if (local_20 == (Func *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x4e0,"(bailOutInfo)","bailOutInfo");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this->field_0x38 = this->field_0x38 & 0xef;
  this->field_0x38 = this->field_0x38 & 0xbf;
  return (BailOutInfo *)local_20;
}

Assistant:

BailOutInfo *
Instr::UnlinkBailOutInfo()
{
    BailOutInfo *bailOutInfo;
    Assert(this->HasBailOutInfo() || this->HasAuxBailOut());

    switch (this->m_kind)
    {
    case InstrKindInstr:
        bailOutInfo = ((BailOutInstr const *)this)->bailOutInfo;
        ((BailOutInstr *)this)->bailOutInfo = nullptr;
        break;
    case InstrKindProfiled:
        bailOutInfo = ((ProfiledBailOutInstr const *)this)->bailOutInfo;
        ((ProfiledBailOutInstr *)this)->bailOutInfo = nullptr;
        break;
    case InstrKindBranch:
        bailOutInfo = ((BranchBailOutInstr const *)this)->bailOutInfo;
        ((BranchBailOutInstr *)this)->bailOutInfo = nullptr;
        break;
    default:
        Assert(false);
        return nullptr;
    }
    Assert(bailOutInfo);
#if 0
    if (bailOutInfo->bailOutInstr == this)
    {
        bailOutInfo->bailOutInstr = nullptr;
    }
#endif
    this->hasBailOutInfo = false;
    this->hasAuxBailOut = false;

    return bailOutInfo;
}